

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cc
# Opt level: O2

void __thiscall Server::~Server(Server *this)

{
  int in_ESI;
  
  close(this,in_ESI);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>);
  std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>::
  ~vector(&this->_clientSockets);
  std::_Function_base::~_Function_base(&(this->_handleRead).super__Function_base);
  std::_Function_base::~_Function_base(&(this->_handleAccept).super__Function_base);
  return;
}

Assistant:

Server::~Server()
{
  this->close();
}